

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inversespectrogram.cpp
# Opt level: O2

int __thiscall ncnn::InverseSpectrogram::load_param(InverseSpectrogram *this,ParamDict *pd)

{
  uint uVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  bool bVar11;
  float fVar12;
  double dVar13;
  
  uVar6 = 0;
  iVar3 = ParamDict::get(pd,0,0);
  this->n_fft = iVar3;
  iVar3 = ParamDict::get(pd,1,0);
  this->returns = iVar3;
  iVar3 = ParamDict::get(pd,2,this->n_fft / 4);
  this->hoplen = iVar3;
  iVar3 = ParamDict::get(pd,3,this->n_fft);
  this->winlen = iVar3;
  iVar3 = ParamDict::get(pd,4,0);
  this->window_type = iVar3;
  iVar3 = ParamDict::get(pd,5,1);
  this->center = iVar3;
  iVar3 = ParamDict::get(pd,7,0);
  this->normalized = iVar3;
  Mat::create(&this->window_data,(uint)(iVar3 == 2) + this->n_fft,4,(Allocator *)0x0);
  pfVar2 = (float *)(this->window_data).data;
  uVar1 = this->n_fft;
  iVar3 = this->winlen;
  iVar4 = uVar1 - iVar3;
  pfVar10 = pfVar2;
  if (0 < (int)((long)iVar4 / 2)) {
    uVar6 = (long)iVar4 / 2 & 0xffffffff;
  }
  while (iVar9 = (int)uVar6, uVar6 = (ulong)(iVar9 - 1), iVar9 != 0) {
    *pfVar10 = 0.0;
    pfVar10 = pfVar10 + 1;
  }
  iVar9 = this->window_type;
  if (iVar9 == 0) {
    iVar8 = 0;
    if (0 < iVar3) {
      iVar8 = iVar3;
    }
    while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
      *pfVar10 = 1.0;
      pfVar10 = pfVar10 + 1;
    }
  }
  if (iVar9 == 1) {
    iVar8 = 0;
    if (0 < iVar3) {
      iVar8 = iVar3;
    }
    dVar13 = 0.0;
    while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
      fVar12 = cosf((float)(dVar13 * 6.283185307179586 * (1.0 / (double)iVar3)));
      *pfVar10 = 0.5 - fVar12 * 0.5;
      pfVar10 = pfVar10 + 1;
      dVar13 = dVar13 + 1.0;
    }
  }
  if (iVar9 == 2) {
    iVar9 = 0;
    if (0 < iVar3) {
      iVar9 = iVar3;
    }
    dVar13 = 0.0;
    while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
      fVar12 = cosf((float)(dVar13 * 6.283185307179586 * (1.0 / (double)iVar3)));
      *pfVar10 = fVar12 * -0.46 + 0.54;
      pfVar10 = pfVar10 + 1;
      dVar13 = dVar13 + 1.0;
    }
  }
  uVar5 = iVar4 / -2 + iVar4;
  uVar7 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  for (; (int)uVar6 != (int)uVar7; uVar7 = uVar7 + 1) {
    pfVar10[uVar7] = 0.0;
  }
  if (this->normalized == 2) {
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    fVar12 = 0.0;
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      fVar12 = fVar12 + pfVar2[uVar6] * pfVar2[uVar6];
    }
    pfVar2[(int)uVar1] = SQRT(fVar12);
  }
  return 0;
}

Assistant:

int InverseSpectrogram::load_param(const ParamDict& pd)
{
    n_fft = pd.get(0, 0);
    returns = pd.get(1, 0);
    hoplen = pd.get(2, n_fft / 4);
    winlen = pd.get(3, n_fft);
    window_type = pd.get(4, 0);
    center = pd.get(5, 1);
    normalized = pd.get(7, 0);

    // assert winlen <= n_fft
    // generate window
    window_data.create(normalized == 2 ? n_fft + 1 : n_fft);
    {
        float* p = window_data;
        for (int i = 0; i < (n_fft - winlen) / 2; i++)
        {
            *p++ = 0.f;
        }
        if (window_type == 0)
        {
            // all ones
            for (int i = 0; i < winlen; i++)
            {
                *p++ = 1.f;
            }
        }
        if (window_type == 1)
        {
            // hann window
            for (int i = 0; i < winlen; i++)
            {
                *p++ = 0.5f * (1 - cosf(2 * 3.14159265358979323846 * i / winlen));
            }
        }
        if (window_type == 2)
        {
            // hamming window
            for (int i = 0; i < winlen; i++)
            {
                *p++ = 0.54f - 0.46f * cosf(2 * 3.14159265358979323846 * i / winlen);
            }
        }
        for (int i = 0; i < n_fft - winlen - (n_fft - winlen) / 2; i++)
        {
            *p++ = 0.f;
        }

        // pre-calculated window norm factor
        if (normalized == 2)
        {
            float sqsum = 0.f;
            for (int i = 0; i < n_fft; i++)
            {
                sqsum += window_data[i] * window_data[i];
            }
            window_data[n_fft] = sqrt(sqsum);
        }
    }

    return 0;
}